

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitblt.c
# Opt level: O0

LispPTR N_OP_pilotbitblt(LispPTR pilot_bt_tbl,LispPTR tos)

{
  short sVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint w_00;
  uint h_00;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  LispPTR *pLVar11;
  DLword *ybase;
  sbyte sVar12;
  int iVar14;
  int iVar15;
  uint *puVar16;
  long lVar17;
  bool bVar18;
  bool bVar19;
  uint local_1b0;
  int local_1ac;
  uint local_1a8;
  uint local_1a4;
  uint local_1a0;
  uint local_19c;
  uint local_12c;
  int local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  uint local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  uint local_f0;
  int srcRshift;
  uint newS;
  uint savedS;
  uint shS;
  uint *src32addr;
  uint *dst32addr;
  uint sdw_mask;
  uint postloop_mask;
  uint preloop_mask;
  int bb_fast;
  uint *OrigDstAddr;
  uint *OrigSrcAddr;
  int fwd;
  int src32rbit;
  int dst32rbit;
  int abc;
  UNSIGNED x32ia;
  UNSIGNED x32nbyt;
  UNSIGNED x32byta;
  uint local_80;
  uint mask;
  uint dstdata;
  uint dstold;
  uint srcRmask;
  int dst32lbit;
  int srcLshift;
  int src32lbit;
  int dstnumL;
  int num_lines_remaining;
  int curr_gray_line;
  int num_gray;
  int gray;
  int op;
  int src_comp;
  int backwardflg;
  int dstbpl;
  int srcbpl;
  int h;
  int w;
  int dx;
  int sx;
  DLword *dstbase;
  DLword *srcbase;
  PILOTBBT *pbt;
  LispPTR tos_local;
  LispPTR pilot_bt_tbl_local;
  sbyte sVar13;
  
  if (kbd_for_makeinit == 0) {
    init_keyboard(0);
    kbd_for_makeinit = 1;
  }
  pLVar11 = NativeAligned4FromLAddr(pilot_bt_tbl);
  w_00 = (uint)*(ushort *)((long)pLVar11 + 0x12);
  h_00 = (uint)(ushort)pLVar11[4];
  if ((h_00 != 0) && (w_00 != 0)) {
    uVar5 = (uint)*(ushort *)((long)pLVar11 + 6);
    uVar10 = (uint)*(ushort *)((long)pLVar11 + 0xe);
    sVar1 = *(short *)((long)pLVar11 + 0x16);
    ScreenLocked = 1;
    dstbase = NativeAligned2FromLAddr
                        (CONCAT22((short)pLVar11[2],*(undefined2 *)((long)pLVar11 + 10)));
    ybase = NativeAligned2FromLAddr(CONCAT22((short)*pLVar11,*(undefined2 *)((long)pLVar11 + 2)));
    iVar6 = (int)(short)(ushort)pLVar11[3];
    uVar7 = (uint)(short)(ushort)pLVar11[1];
    uVar2 = *(ushort *)((long)pLVar11 + 0x16) >> 0xb & 1;
    uVar3 = *(ushort *)((long)pLVar11 + 0x16) >> 9 & 3;
    uVar4 = *(ushort *)((long)pLVar11 + 0x16) >> 0xc & 1;
    uVar8 = (uint)((ushort)pLVar11[3] & 0xf);
    dstnumL = (int)((ushort)pLVar11[3] >> 8 & 0xf);
    srcRmask = 0;
    dstdata = 0;
    OrigSrcAddr._4_4_ = 0;
    OrigDstAddr = (uint *)0x0;
    srcRshift = 0;
    local_f0 = 0;
    bVar18 = sVar1 < 0;
    bVar19 = (((ushort)pLVar11[3] | (ushort)pLVar11[1]) & 0x1f) != 0;
    src32lbit = h_00;
    if (uVar4 == 0) {
      if (bVar18) {
        uVar9 = (uVar5 + w_00) - 1;
        if ((int)uVar9 < 0) {
          lVar17 = -(long)((int)(7 - uVar9) >> 3);
        }
        else {
          lVar17 = (long)((int)uVar9 >> 3);
        }
        x32nbyt = (long)ybase + lVar17;
        _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
        fwd = (int)((x32nbyt & 3) << 3) + (uVar9 & 7);
        dstold = (fwd - w_00) + 1 & 0x1f;
        sdw_mask = -1 << (0x1fU - (char)fwd & 0x1f);
        if (dstold == 0) {
          local_124 = 0xffffffff;
        }
        else {
          local_124 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
        }
        dst32addr._4_4_ = local_124;
        dst32addr._0_4_ = sdw_mask & local_124;
        if ((int)((w_00 - fwd) + -1) < 1) {
          local_128 = 0;
        }
        else {
          local_128 = (int)((w_00 - fwd) + -1) >> 5;
        }
        srcLshift = local_128;
        uVar10 = (uVar10 + w_00) - 1;
        if ((int)uVar10 < 0) {
          lVar17 = -(long)((int)(7 - uVar10) >> 3);
        }
        else {
          lVar17 = (long)((int)uVar10 >> 3);
        }
        x32nbyt = (long)dstbase + lVar17;
        OrigDstAddr = (uint *)(x32nbyt - (x32nbyt & 3));
        OrigSrcAddr._4_4_ = (int)((x32nbyt & 3) << 3) + (uVar10 & 7);
        dst32lbit = (OrigSrcAddr._4_4_ - w_00) + 1 & 0x1f;
        local_f0 = dstold - dst32lbit;
        srcRmask = dst32lbit - dstold & 0x1f;
        if (srcRmask == 0) {
          local_12c = 0;
        }
        else {
          local_12c = -1 << (sbyte)srcRmask ^ 0xffffffff;
        }
        dstdata = local_12c;
      }
      else {
        if ((int)uVar5 < 0) {
          lVar17 = -(long)((int)(7 - uVar5) >> 3);
        }
        else {
          lVar17 = (long)((int)uVar5 >> 3);
        }
        x32nbyt = (long)ybase + lVar17;
        _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
        dstold = (int)((x32nbyt & 3) << 3) + (uVar5 & 7);
        fwd = (dstold + w_00) - 1 & 0x1f;
        if (dstold == 0) {
          local_11c = 0xffffffff;
        }
        else {
          local_11c = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
        }
        sdw_mask = local_11c;
        dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
        dst32addr._0_4_ = local_11c & dst32addr._4_4_;
        srcLshift = ((int)(dstold + w_00) >> 5) + -1;
        if ((int)uVar10 < 0) {
          lVar17 = -(long)((int)(7 - uVar10) >> 3);
        }
        else {
          lVar17 = (long)((int)uVar10 >> 3);
        }
        x32nbyt = (long)dstbase + lVar17;
        OrigDstAddr = (uint *)(x32nbyt - (x32nbyt & 3));
        dst32lbit = (int)((x32nbyt & 3) << 3) + (uVar10 & 7);
        OrigSrcAddr._4_4_ = (dst32lbit + w_00) - 1 & 0x1f;
        local_f0 = dstold - dst32lbit;
        srcRmask = dst32lbit - dstold & 0x1f;
        if (srcRmask == 0) {
          local_120 = 0xffffffff;
        }
        else {
          local_120 = -1 << (sbyte)srcRmask ^ 0xffffffff;
        }
        dstdata = local_120;
      }
      local_f0 = local_f0 & 0x1f;
      _savedS = OrigDstAddr;
    }
    else {
      if ((int)uVar5 < 0) {
        lVar17 = -(long)((int)(7 - uVar5) >> 3);
      }
      else {
        lVar17 = (long)((int)uVar5 >> 3);
      }
      x32nbyt = (long)ybase + lVar17;
      _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
      dstold = (int)((x32nbyt & 3) << 3) + (uVar5 & 7);
      fwd = (dstold + w_00) - 1 & 0x1f;
      if (dstold == 0) {
        local_118 = 0xffffffff;
      }
      else {
        local_118 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
      }
      sdw_mask = local_118;
      dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
      dst32addr._0_4_ = local_118 & dst32addr._4_4_;
      srcLshift = ((int)(dstold + w_00) >> 5) + -1;
      bVar19 = (uVar7 & 0x1f) != 0;
      dst32lbit = uVar10 & 0xf;
      _savedS = OrigDstAddr;
    }
    while( true ) {
      src32addr = _preloop_mask;
      iVar14 = src32lbit + -1;
      if (src32lbit < 1) break;
      if (uVar4 == 0) {
        sVar12 = (sbyte)local_f0;
        sVar13 = (sbyte)srcRmask;
        if (bVar18) {
          if ((OrigSrcAddr._4_4_ < (uint)fwd) && (dstold + 1 < dst32lbit + w_00)) {
            puVar16 = _savedS + -1;
            uVar10 = *_savedS;
            _savedS = _savedS + -2;
            newS = uVar10 >> sVar12 & dstdata | *puVar16 << sVar13;
            srcRshift = *puVar16 >> sVar12 & dstdata;
          }
          else {
            if (OrigSrcAddr._4_4_ < (uint)fwd) {
              newS = *_savedS >> sVar12 & dstdata;
            }
            else {
              newS = *_savedS << sVar13;
              srcRshift = *_savedS >> sVar12 & dstdata;
            }
            _savedS = _savedS + -1;
          }
          if (uVar2 != 0) {
            newS = newS ^ 0xffffffff;
          }
          if (dstold + w_00 < 0x21) {
            x32byta._4_4_ = (uint)dst32addr;
          }
          else {
            local_80 = *_preloop_mask;
            uVar10 = local_80 & ~sdw_mask;
            switch(uVar3) {
            case 0:
              local_80 = newS;
              break;
            case 1:
              local_80 = newS & local_80;
              break;
            case 2:
              local_80 = newS | local_80;
              break;
            case 3:
              local_80 = newS ^ local_80;
            }
            *_preloop_mask = uVar10 | sdw_mask & local_80;
            src32addr = _preloop_mask + -1;
            if (dst32lbit == dstold) {
              if (uVar2 == 0) {
                switch(uVar3) {
                case 0:
                  local_10c = srcLshift;
                  while (local_10c = local_10c + -1, -1 < local_10c) {
                    *src32addr = *_savedS;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 1:
                  local_10c = srcLshift;
                  while (local_10c = local_10c + -1, -1 < local_10c) {
                    *src32addr = *_savedS & *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 2:
                  local_10c = srcLshift;
                  while (local_10c = local_10c + -1, -1 < local_10c) {
                    *src32addr = *_savedS | *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 3:
                  local_10c = srcLshift;
                  while (local_10c = local_10c + -1, -1 < local_10c) {
                    *src32addr = *_savedS ^ *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                }
              }
              else {
                switch(uVar3) {
                case 0:
                  local_108 = srcLshift;
                  while (local_108 = local_108 + -1, -1 < local_108) {
                    *src32addr = *_savedS ^ 0xffffffff;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 1:
                  local_108 = srcLshift;
                  while (local_108 = local_108 + -1, -1 < local_108) {
                    *src32addr = (*_savedS ^ 0xffffffff) & *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 2:
                  local_108 = srcLshift;
                  while (local_108 = local_108 + -1, -1 < local_108) {
                    *src32addr = *_savedS ^ 0xffffffff | *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 3:
                  local_108 = srcLshift;
                  while (local_108 = local_108 + -1, -1 < local_108) {
                    *src32addr = *_savedS ^ 0xffffffff ^ *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                }
              }
            }
            else if (uVar2 == 0) {
              switch(uVar3) {
              case 0:
                local_114 = srcLshift;
                while (local_114 = local_114 + -1, -1 < local_114) {
                  uVar10 = srcRshift | *_savedS << sVar13;
                  srcRshift = *_savedS >> sVar12;
                  *src32addr = uVar10;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 1:
                local_114 = srcLshift;
                while (local_114 = local_114 + -1, -1 < local_114) {
                  uVar10 = srcRshift | *_savedS << sVar13;
                  srcRshift = *_savedS >> sVar12;
                  *src32addr = uVar10 & *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 2:
                local_114 = srcLshift;
                while (local_114 = local_114 + -1, -1 < local_114) {
                  uVar10 = srcRshift | *_savedS << sVar13;
                  srcRshift = *_savedS >> sVar12;
                  *src32addr = uVar10 | *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 3:
                local_114 = srcLshift;
                while (local_114 = local_114 + -1, -1 < local_114) {
                  uVar10 = srcRshift | *_savedS << sVar13;
                  srcRshift = *_savedS >> sVar12;
                  *src32addr = uVar10 ^ *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
              }
            }
            else {
              switch(uVar3) {
              case 0:
                local_110 = srcLshift;
                while (local_110 = local_110 + -1, -1 < local_110) {
                  uVar10 = srcRshift | *_savedS << sVar13;
                  srcRshift = *_savedS >> sVar12;
                  *src32addr = uVar10 ^ 0xffffffff;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 1:
                local_110 = srcLshift;
                while (local_110 = local_110 + -1, -1 < local_110) {
                  uVar10 = srcRshift | *_savedS << sVar13;
                  srcRshift = *_savedS >> sVar12;
                  *src32addr = (uVar10 ^ 0xffffffff) & *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 2:
                local_110 = srcLshift;
                while (local_110 = local_110 + -1, -1 < local_110) {
                  uVar10 = srcRshift | *_savedS << sVar13;
                  srcRshift = *_savedS >> sVar12;
                  *src32addr = uVar10 ^ 0xffffffff | *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 3:
                local_110 = srcLshift;
                while (local_110 = local_110 + -1, -1 < local_110) {
                  uVar10 = srcRshift | *_savedS << sVar13;
                  srcRshift = *_savedS >> sVar12;
                  *src32addr = uVar10 ^ 0xffffffff ^ *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
              }
            }
            if (dstold == 0) goto LAB_0011d63e;
            if ((uint)dst32lbit < dstold) {
              newS = srcRshift;
            }
            else {
              newS = srcRshift | *_savedS << sVar13;
            }
            if (uVar2 != 0) {
              newS = newS ^ 0xffffffff;
            }
            x32byta._4_4_ = dst32addr._4_4_;
          }
          goto LAB_0011d5ad;
        }
        if ((dstold < (uint)dst32lbit) && (0x20 < dst32lbit + w_00)) {
          puVar16 = _savedS + 1;
          uVar10 = *_savedS;
          _savedS = _savedS + 2;
          newS = uVar10 << sVar13 | *puVar16 >> sVar12 & dstdata;
          srcRshift = *puVar16 << sVar13 & (dstdata ^ 0xffffffff);
        }
        else {
          if (dstold < (uint)dst32lbit) {
            newS = *_savedS << sVar13;
          }
          else {
            newS = *_savedS >> sVar12 & dstdata;
            srcRshift = *_savedS << sVar13 & (dstdata ^ 0xffffffff);
          }
          _savedS = _savedS + 1;
        }
        if (uVar2 != 0) {
          newS = newS ^ 0xffffffff;
        }
        if (dstold + w_00 < 0x21) {
          x32byta._4_4_ = (uint)dst32addr;
          goto LAB_0011d5ad;
        }
        local_80 = *_preloop_mask;
        uVar10 = local_80 & ~sdw_mask;
        switch(uVar3) {
        case 0:
          local_80 = newS;
          break;
        case 1:
          local_80 = newS & local_80;
          break;
        case 2:
          local_80 = newS | local_80;
          break;
        case 3:
          local_80 = newS ^ local_80;
        }
        *_preloop_mask = uVar10 | sdw_mask & local_80;
        src32addr = _preloop_mask + 1;
        if (dst32lbit == dstold) {
          if (uVar2 == 0) {
            switch(uVar3) {
            case 0:
              local_fc = srcLshift;
              while (local_fc = local_fc + -1, -1 < local_fc) {
                *src32addr = *_savedS;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 1:
              local_fc = srcLshift;
              while (local_fc = local_fc + -1, -1 < local_fc) {
                *src32addr = *_savedS & *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 2:
              local_fc = srcLshift;
              while (local_fc = local_fc + -1, -1 < local_fc) {
                *src32addr = *_savedS | *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 3:
              local_fc = srcLshift;
              while (local_fc = local_fc + -1, -1 < local_fc) {
                *src32addr = *_savedS ^ *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
            }
          }
          else {
            switch(uVar3) {
            case 0:
              local_f8 = srcLshift;
              while (local_f8 = local_f8 + -1, -1 < local_f8) {
                *src32addr = *_savedS ^ 0xffffffff;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 1:
              local_f8 = srcLshift;
              while (local_f8 = local_f8 + -1, -1 < local_f8) {
                *src32addr = (*_savedS ^ 0xffffffff) & *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 2:
              local_f8 = srcLshift;
              while (local_f8 = local_f8 + -1, -1 < local_f8) {
                *src32addr = *_savedS ^ 0xffffffff | *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 3:
              local_f8 = srcLshift;
              while (local_f8 = local_f8 + -1, -1 < local_f8) {
                *src32addr = *_savedS ^ 0xffffffff ^ *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
            }
          }
        }
        else if (uVar2 == 0) {
          switch(uVar3) {
          case 0:
            local_104 = srcLshift;
            while (local_104 = local_104 + -1, -1 < local_104) {
              uVar10 = srcRshift | *_savedS >> sVar12;
              srcRshift = *_savedS << sVar13;
              *src32addr = uVar10;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 1:
            local_104 = srcLshift;
            while (local_104 = local_104 + -1, -1 < local_104) {
              uVar10 = srcRshift | *_savedS >> sVar12;
              srcRshift = *_savedS << sVar13;
              *src32addr = uVar10 & *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 2:
            local_104 = srcLshift;
            while (local_104 = local_104 + -1, -1 < local_104) {
              uVar10 = srcRshift | *_savedS >> sVar12;
              srcRshift = *_savedS << sVar13;
              *src32addr = uVar10 | *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 3:
            local_104 = srcLshift;
            while (local_104 = local_104 + -1, -1 < local_104) {
              uVar10 = srcRshift | *_savedS >> sVar12;
              srcRshift = *_savedS << sVar13;
              *src32addr = uVar10 ^ *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
          }
        }
        else {
          switch(uVar3) {
          case 0:
            local_100 = srcLshift;
            while (local_100 = local_100 + -1, -1 < local_100) {
              uVar10 = srcRshift | *_savedS >> sVar12;
              srcRshift = *_savedS << sVar13;
              *src32addr = uVar10 ^ 0xffffffff;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 1:
            local_100 = srcLshift;
            while (local_100 = local_100 + -1, -1 < local_100) {
              uVar10 = srcRshift | *_savedS >> sVar12;
              srcRshift = *_savedS << sVar13;
              *src32addr = (uVar10 ^ 0xffffffff) & *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 2:
            local_100 = srcLshift;
            while (local_100 = local_100 + -1, -1 < local_100) {
              uVar10 = srcRshift | *_savedS >> sVar12;
              srcRshift = *_savedS << sVar13;
              *src32addr = uVar10 ^ 0xffffffff | *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 3:
            local_100 = srcLshift;
            while (local_100 = local_100 + -1, -1 < local_100) {
              uVar10 = srcRshift | *_savedS >> sVar12;
              srcRshift = *_savedS << sVar13;
              *src32addr = uVar10 ^ 0xffffffff ^ *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
          }
        }
        if (fwd != 0x1f) {
          if ((uint)fwd < OrigSrcAddr._4_4_) {
            newS = srcRshift;
          }
          else {
            newS = srcRshift | *_savedS >> sVar12 & dstdata;
          }
          if (uVar2 != 0) {
            newS = newS ^ 0xffffffff;
          }
          x32byta._4_4_ = dst32addr._4_4_;
          goto LAB_0011d5ad;
        }
      }
      else {
        srcRmask = dst32lbit - dstold & 0xf;
        uVar10 = CONCAT22(*dstbase,*dstbase) << (sbyte)srcRmask;
        newS = uVar10 >> 0x10 | uVar10;
        if (uVar2 != 0) {
          newS = newS ^ 0xffffffff;
        }
        if (dstold + w_00 < 0x21) {
          x32byta._4_4_ = (uint)dst32addr;
        }
        else {
          local_80 = *_preloop_mask;
          uVar10 = local_80 & ~sdw_mask;
          switch(uVar3) {
          case 0:
            local_80 = newS;
            break;
          case 1:
            local_80 = newS & local_80;
            break;
          case 2:
            local_80 = newS | local_80;
            break;
          case 3:
            local_80 = newS ^ local_80;
          }
          *_preloop_mask = local_80 & sdw_mask | uVar10;
          src32addr = _preloop_mask + 1;
          switch(uVar3) {
          case 0:
            local_f4 = srcLshift;
            while (local_f4 = local_f4 + -1, -1 < local_f4) {
              *src32addr = newS;
              src32addr = src32addr + 1;
            }
            break;
          case 1:
            local_f4 = srcLshift;
            while (local_f4 = local_f4 + -1, -1 < local_f4) {
              *src32addr = newS & *src32addr;
              src32addr = src32addr + 1;
            }
            break;
          case 2:
            local_f4 = srcLshift;
            while (local_f4 = local_f4 + -1, -1 < local_f4) {
              *src32addr = newS | *src32addr;
              src32addr = src32addr + 1;
            }
            break;
          case 3:
            local_f4 = srcLshift;
            while (local_f4 = local_f4 + -1, -1 < local_f4) {
              *src32addr = newS ^ *src32addr;
              src32addr = src32addr + 1;
            }
          }
          if (fwd == 0x1f) goto LAB_0011d63e;
          x32byta._4_4_ = dst32addr._4_4_;
        }
LAB_0011d5ad:
        local_80 = *src32addr;
        uVar10 = local_80 & ~x32byta._4_4_;
        switch(uVar3) {
        case 0:
          local_80 = newS;
          break;
        case 1:
          local_80 = newS & local_80;
          break;
        case 2:
          local_80 = newS | local_80;
          break;
        case 3:
          local_80 = newS ^ local_80;
        }
        *src32addr = uVar10 | x32byta._4_4_ & local_80;
      }
LAB_0011d63e:
      iVar15 = (int)uVar7 >> 5;
      src32lbit = iVar14;
      if (uVar4 == 0) {
        iVar14 = iVar6 >> 5;
        if (bVar18) {
          if (bVar19) {
            uVar10 = uVar7 + fwd;
            if ((int)uVar10 < 0) {
              lVar17 = (long)((int)(0x1f - uVar10) >> 5) * -4;
            }
            else {
              lVar17 = (long)((int)dstold >> 5) * 4;
            }
            fwd = uVar10 & 0x1f;
            dstold = (fwd - w_00) + 1 & 0x1f;
            sdw_mask = -1 << (0x1fU - (char)fwd & 0x1f);
            if (dstold == 0) {
              local_1a8 = 0xffffffff;
            }
            else {
              local_1a8 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
            }
            dst32addr._4_4_ = local_1a8;
            dst32addr._0_4_ = sdw_mask & local_1a8;
            if ((int)((w_00 - fwd) + -1) < 1) {
              local_1ac = 0;
            }
            else {
              local_1ac = (int)((w_00 - fwd) + -1) >> 5;
            }
            srcLshift = local_1ac;
          }
          else {
            lVar17 = (long)iVar15 * 4;
          }
          src32addr = (uint *)((long)_preloop_mask + lVar17);
          if (bVar19) {
            uVar10 = iVar6 + OrigSrcAddr._4_4_;
            if ((int)uVar10 < 0) {
              lVar17 = (long)((int)(0x1f - uVar10) >> 5) * -4;
            }
            else {
              lVar17 = (long)((int)uVar10 >> 5) * 4;
            }
            OrigSrcAddr._4_4_ = uVar10 & 0x1f;
            dst32lbit = (OrigSrcAddr._4_4_ - w_00) + 1 & 0x1f;
            local_f0 = dstold - dst32lbit & 0x1f;
            srcRmask = dst32lbit - dstold & 0x1f;
            if (srcRmask == 0) {
              local_1b0 = 0;
            }
            else {
              local_1b0 = -1 << (sbyte)srcRmask ^ 0xffffffff;
            }
            dstdata = local_1b0;
          }
          else {
            lVar17 = (long)iVar14 * 4;
          }
          _savedS = (uint *)((long)OrigDstAddr + lVar17);
          _preloop_mask = src32addr;
          OrigDstAddr = _savedS;
        }
        else {
          if (bVar19) {
            iVar15 = (int)(uVar7 + dstold) >> 5;
            dstold = uVar7 + dstold & 0x1f;
            fwd = (dstold + w_00) - 1 & 0x1f;
            if (dstold == 0) {
              local_1a0 = 0xffffffff;
            }
            else {
              local_1a0 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
            }
            sdw_mask = local_1a0;
            dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
            dst32addr._0_4_ = local_1a0 & dst32addr._4_4_;
            srcLshift = ((int)(dstold + w_00) >> 5) + -1;
          }
          _preloop_mask = _preloop_mask + iVar15;
          if (bVar19) {
            iVar14 = iVar6 + dst32lbit >> 5;
            dst32lbit = iVar6 + dst32lbit & 0x1f;
            OrigSrcAddr._4_4_ = (dst32lbit + w_00) - 1 & 0x1f;
            local_f0 = dstold - dst32lbit & 0x1f;
            srcRmask = dst32lbit - dstold & 0x1f;
            if (srcRmask == 0) {
              local_1a4 = 0xffffffff;
            }
            else {
              local_1a4 = -1 << (sbyte)srcRmask ^ 0xffffffff;
            }
            dstdata = local_1a4;
          }
          OrigDstAddr = OrigDstAddr + iVar14;
          _savedS = OrigDstAddr;
        }
      }
      else {
        if (bVar19) {
          iVar15 = (int)(uVar7 + dstold) >> 5;
          dstold = uVar7 + dstold & 0x1f;
          fwd = (dstold + w_00) - 1 & 0x1f;
          if (dstold == 0) {
            local_19c = 0xffffffff;
          }
          else {
            local_19c = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
          }
          sdw_mask = local_19c;
          dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
          dst32addr._0_4_ = local_19c & dst32addr._4_4_;
          srcLshift = ((int)(dstold + w_00) >> 5) + -1;
        }
        _preloop_mask = _preloop_mask + iVar15;
        dstnumL = dstnumL + 1;
        if (dstnumL < (int)(uVar8 + 1)) {
          dstbase = dstbase + 1;
        }
        else {
          dstnumL = 0;
          dstbase = dstbase + -(long)(int)uVar8;
        }
      }
    }
    flush_display_lineregion((long)(int)uVar5,ybase,w_00,h_00);
    ScreenLocked = 0;
  }
  return pilot_bt_tbl;
}

Assistant:

LispPTR N_OP_pilotbitblt(LispPTR pilot_bt_tbl, LispPTR tos)
{
  PILOTBBT *pbt;
  DLword *srcbase, *dstbase;
#if defined(SUNDISPLAY) || defined(DOS)
  int displayflg;
#endif
  int sx, dx, w, h, srcbpl, dstbpl, backwardflg;
  int src_comp, op, gray, num_gray, curr_gray_line;

#ifdef INIT

  /* for init, we have to initialize the pointers at the
     first call to pilotbitblt or we die.  If we do it
     earlier we die also.  We set a new flag so we don't
     do it more than once which is a lose also.

     I put this in an ifdef so there won't be any extra
     code when making a regular LDE.  */

  if (!kbd_for_makeinit) {
    init_keyboard(0);
    kbd_for_makeinit = 1;
  }

#endif

  pbt = (PILOTBBT *)NativeAligned4FromLAddr(pilot_bt_tbl);

  w = pbt->pbtwidth;
  h = pbt->pbtheight;
  if ((h <= 0) || (w <= 0)) return (pilot_bt_tbl);
  dx = pbt->pbtdestbit;
  sx = pbt->pbtsourcebit;
  backwardflg = pbt->pbtbackward;
/* if displayflg != 0 then source or destination is DisplayBitMap */
#ifdef DOS
  currentdsp->device.locked++;
#else
  ScreenLocked = T;
#endif /* DOS */

#if defined(SUNDISPLAY) || defined(DOS)
  displayflg = cursorin(pbt->pbtdesthi, (pbt->pbtdestlo + (dx >> 4)), w, h, backwardflg) ||
               cursorin(pbt->pbtsourcehi, (pbt->pbtsourcelo + (sx >> 4)), w, h, backwardflg);
#endif /* SUNDISPLAY */

  srcbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtsourcehi, pbt->pbtsourcelo));
  dstbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtdesthi, pbt->pbtdestlo));

  srcbpl = pbt->pbtsourcebpl;
  dstbpl = pbt->pbtdestbpl;
  src_comp = pbt->pbtsourcetype;
  op = pbt->pbtoperation;
  gray = pbt->pbtusegray;
  num_gray = ((TEXTUREBBT *)pbt)->pbtgrayheightlessone + 1;
  curr_gray_line = ((TEXTUREBBT *)pbt)->pbtgrayoffset;

#ifdef DOS
  if (displayflg) (currentdsp->mouse_invisible)(currentdsp, IOPage);
  ;
#endif /* SUNDISPLAY / DOS */

  new_bitblt_code;

#ifdef DOS
      flush_display_lineregion(dx, dstbase, w, h);
  if (displayflg) (currentdsp->mouse_visible)(IOPage->dlmousex, IOPage->dlmousey);
#endif /* SUNDISPLAY / DOS */

#if defined(XWINDOW) || defined(SDL)
  flush_display_lineregion(dx, dstbase, w, h);
#endif /* XWINDOW */

#ifdef DOS
  currentdsp->device.locked--;
#else
  ScreenLocked = NIL;
#endif /* DOS */

  return (pilot_bt_tbl);

}